

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void custom_compare_commit_compact(bool eqkeys)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  long lVar2;
  size_t keylen;
  uint uVar3;
  int iVar4;
  char *__format;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  uint64_t user_param;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char keybuf [1024];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  dummy* > errorlog.txt");
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.multi_kv_instances = true;
  kvs_config.custom_cmp_param = &user_param;
  user_param = 0x1234;
  kvs_config.custom_cmp = _cmp_variable;
  system("rm -rf  dummy* > errorlog.txt");
  fVar1 = fdb_open(&dbfile,"./dummy1",&fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xad8);
    custom_compare_commit_compact(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xad8,"void custom_compare_commit_compact(bool)");
  }
  fVar1 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    uVar3 = 0;
    do {
      if (uVar3 == 10) {
        fdb_compact(dbfile,(char *)0x0);
        fdb_commit(dbfile,'\x01');
        fdb_compact(dbfile,(char *)0x0);
        fdb_iterator_init(db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
        iVar4 = -1;
        do {
          fVar1 = fdb_iterator_get(iterator,&rdoc);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xaf9);
            custom_compare_commit_compact(bool)::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xaf9,"void custom_compare_commit_compact(bool)");
          }
          fdb_doc_free(rdoc);
          rdoc = (fdb_doc *)0x0;
          fVar1 = fdb_iterator_next(iterator);
          iVar4 = iVar4 + 1;
        } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
        if (eqkeys) {
          if (iVar4 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xb02);
            custom_compare_commit_compact(bool)::__test_pass = 1;
            __assert_fail("count == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xb02,"void custom_compare_commit_compact(bool)");
          }
        }
        else if (iVar4 != 9) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xb04);
          custom_compare_commit_compact(bool)::__test_pass = 1;
          __assert_fail("count == n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xb04,"void custom_compare_commit_compact(bool)");
        }
        fdb_iterator_close(iterator);
        fdb_close(dbfile);
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (custom_compare_commit_compact(bool)::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"custom compare commit compact");
        return;
      }
      if (eqkeys) {
        sprintf(keybuf,"%d",(ulong)uVar3);
        for (lVar2 = 1; lVar2 != 0x400; lVar2 = lVar2 + 1) {
          keybuf[lVar2] = 'a';
        }
      }
      else {
        sprintf(keybuf,"000%d",(ulong)uVar3);
        for (lVar2 = 4; lVar2 != 0x400; lVar2 = lVar2 + 1) {
          keybuf[lVar2] = 'a';
        }
      }
      handle = db;
      keybuf[0x3ff] = '\0';
      keylen = strlen(keybuf);
      fVar1 = fdb_set_kv(handle,keybuf,keylen,(void *)0x0,0);
      uVar3 = uVar3 + 1;
    } while (fVar1 == FDB_RESULT_SUCCESS);
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xaec);
    custom_compare_commit_compact(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xaec,"void custom_compare_commit_compact(bool)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0xada);
  custom_compare_commit_compact(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xada,"void custom_compare_commit_compact(bool)");
}

Assistant:

void custom_compare_commit_compact(bool eqkeys)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int count;
    int n = 10;
    static const int len = 1024;
    char keybuf[len];
    static const char *achar = "a";
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *iterator;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    uint64_t user_param = 0x1234;
    kvs_config.custom_cmp = _cmp_variable;
    kvs_config.custom_cmp_param = (void*)&user_param;

    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;


    // open db
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);


    for (i=0;i<n;++i){
        if(eqkeys){
            sprintf(keybuf, "%d", i);
            for (j=1;j<len;++j) {
                keybuf[j] = *achar;
            }
        } else {
            sprintf(keybuf, "000%d", i);
            for (j=4;j<len;++j) {
                keybuf[j] = *achar;
            }
        }
        keybuf[len-1] = '\0';
        // set kv
        status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // compact pre & post commit
    fdb_compact(dbfile, NULL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_compact(dbfile, NULL);

    // scan after flush
    count = 0;
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    if (eqkeys) {
        // since the custom cmp function compares only 3rd~8th bytes,
        // all keys are identified as the same key.
        TEST_CHK(count == 1);
    } else {
        TEST_CHK(count == n);
    }

    fdb_iterator_close(iterator);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("custom compare commit compact");

}